

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall siamese::EncoderAcknowledgementState::Clear(EncoderAcknowledgementState *this)

{
  EncoderAcknowledgementState *this_local;
  
  this->Offset = 0;
  this->LossColumn = 0;
  this->LossCount = 0;
  this->DataBytes = 0;
  this->FoundOldest = false;
  return;
}

Assistant:

void EncoderAcknowledgementState::Clear()
{
    // Reset message decoder state
    Offset     = 0;
    LossColumn = 0;
    LossCount  = 0;
    DataBytes  = 0;

    // Reset the oldest column
    FoundOldest = false;
}